

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O2

ostream * testing::internal::operator<<(ostream *os,String *str)

{
  char cVar1;
  char *pcVar2;
  size_t i;
  size_t sVar3;
  
  pcVar2 = str->c_str_;
  if (pcVar2 == (char *)0x0) {
    std::operator<<(os,"(null)");
  }
  else {
    for (sVar3 = 0; sVar3 != str->length_; sVar3 = sVar3 + 1) {
      cVar1 = pcVar2[sVar3];
      if (cVar1 == '\0') {
        std::operator<<(os,"\\0");
      }
      else {
        std::operator<<(os,cVar1);
      }
    }
  }
  return os;
}

Assistant:

inline ::std::ostream& operator<<(::std::ostream& os, const String& str) {
  if (str.c_str() == NULL) {
    os << "(null)";
  } else {
    const char* const c_str = str.c_str();
    for (size_t i = 0; i != str.length(); i++) {
      if (c_str[i] == '\0') {
        os << "\\0";
      } else {
        os << c_str[i];
      }
    }
  }
  return os;
}